

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void gpt_print_usage(int param_1,char **argv,gpt_params *params)

{
  fprintf(_stderr,"usage: %s [options]\n",*argv);
  fputc(10,_stderr);
  fwrite("options:\n",9,1,_stderr);
  fwrite("  -h, --help            show this help message and exit\n",0x38,1,_stderr);
  fwrite("  -s SEED, --seed SEED  RNG seed (default: -1)\n",0x2f,1,_stderr);
  fprintf(_stderr,
          "  -t N, --threads N     number of threads to use during computation (default: %d)\n",
          (ulong)(uint)params->n_threads);
  fwrite("  -p PROMPT, --prompt PROMPT\n",0x1d,1,_stderr);
  fwrite("                        prompt to start generation with (default: random)\n",0x4a,1,
         _stderr);
  fwrite("  -f FNAME, --file FNAME\n",0x19,1,_stderr);
  fwrite("                        load prompt from a file\n",0x30,1,_stderr);
  fwrite("  -tt TOKEN_TEST, --token_test TOKEN_TEST\n",0x2a,1,_stderr);
  fwrite("                        test tokenization\n",0x2a,1,_stderr);
  fprintf(_stderr,"  -n N, --n_predict N   number of tokens to predict (default: %d)\n",
          (ulong)(uint)params->n_predict);
  fprintf(_stderr,"  --top_k N             top-k sampling (default: %d)\n",
          (ulong)(uint)params->top_k);
  fprintf(_stderr,"  --top_p N             top-p sampling (default: %.1f)\n",(double)params->top_p);
  fprintf(_stderr,"  --temp N              temperature (default: %.1f)\n",(double)params->temp);
  fprintf(_stderr,
          "  --repeat-last-n N     last n tokens to consider for penalize (default: %d, 0 = disabled)\n"
          ,(ulong)(uint)params->repeat_last_n);
  fprintf(_stderr,
          "  --repeat-penalty N    penalize repeat sequence of tokens (default: %.2f, 1.0 = disabled)\n"
          ,(double)params->repeat_penalty);
  fprintf(_stderr,"  -b N, --batch_size N  batch size for prompt processing (default: %d)\n",
          (ulong)(uint)params->n_batch);
  fprintf(_stderr,"  -c N, --context N     context / KV cache size (default: %d)\n",
          (ulong)(uint)params->n_ctx);
  fwrite("  --ignore-eos          ignore EOS token during generation\n",0x3b,1,_stderr);
  fprintf(_stderr,
          "  -ngl N, --gpu-layers N  number of layers to offload to GPU on supported models (default: %d)\n"
          ,(ulong)(uint)params->n_gpu_layers);
  fwrite("  -m FNAME, --model FNAME\n",0x1a,1,_stderr);
  fprintf(_stderr,"                        model path (default: %s)\n",
          (params->model)._M_dataplus._M_p);
  fputc(10,_stderr);
  return;
}

Assistant:

void gpt_print_usage(int /*argc*/, char ** argv, const gpt_params & params) {
    fprintf(stderr, "usage: %s [options]\n", argv[0]);
    fprintf(stderr, "\n");
    fprintf(stderr, "options:\n");
    fprintf(stderr, "  -h, --help            show this help message and exit\n");
    fprintf(stderr, "  -s SEED, --seed SEED  RNG seed (default: -1)\n");
    fprintf(stderr, "  -t N, --threads N     number of threads to use during computation (default: %d)\n", params.n_threads);
    fprintf(stderr, "  -p PROMPT, --prompt PROMPT\n");
    fprintf(stderr, "                        prompt to start generation with (default: random)\n");
    fprintf(stderr, "  -f FNAME, --file FNAME\n");
    fprintf(stderr, "                        load prompt from a file\n");
    fprintf(stderr, "  -tt TOKEN_TEST, --token_test TOKEN_TEST\n");
    fprintf(stderr, "                        test tokenization\n");
    fprintf(stderr, "  -n N, --n_predict N   number of tokens to predict (default: %d)\n", params.n_predict);
    fprintf(stderr, "  --top_k N             top-k sampling (default: %d)\n", params.top_k);
    fprintf(stderr, "  --top_p N             top-p sampling (default: %.1f)\n", params.top_p);
    fprintf(stderr, "  --temp N              temperature (default: %.1f)\n", params.temp);
    fprintf(stderr, "  --repeat-last-n N     last n tokens to consider for penalize (default: %d, 0 = disabled)\n", params.repeat_last_n);
    fprintf(stderr, "  --repeat-penalty N    penalize repeat sequence of tokens (default: %.2f, 1.0 = disabled)\n", (double)params.repeat_penalty);
    fprintf(stderr, "  -b N, --batch_size N  batch size for prompt processing (default: %d)\n", params.n_batch);
    fprintf(stderr, "  -c N, --context N     context / KV cache size (default: %d)\n", params.n_ctx);
    fprintf(stderr, "  --ignore-eos          ignore EOS token during generation\n");
    fprintf(stderr, "  -ngl N, --gpu-layers N  number of layers to offload to GPU on supported models (default: %d)\n", params.n_gpu_layers);
    fprintf(stderr, "  -m FNAME, --model FNAME\n");
    fprintf(stderr, "                        model path (default: %s)\n", params.model.c_str());
    fprintf(stderr, "\n");
}